

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O3

void __thiscall
GenericModelPrivate::encodeMime(GenericModelPrivate *this,QMimeData *data,QModelIndexList *indexes)

{
  long lVar1;
  QModelIndex *pQVar2;
  Span *pSVar3;
  type tVar4;
  QModelIndex *pQVar5;
  Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *pDVar6;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  type tVar10;
  type tVar11;
  QAbstractItemModel **ppQVar12;
  QHash<GenericModelItem_*,_QHashDummyValue> QVar13;
  Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *pDVar14;
  ulong uVar15;
  piter it;
  piter it_00;
  QSet<GenericModelItem_*> itemsToSave;
  QByteArray encoded;
  QDataStream stream;
  QHash<GenericModelItem_*,_QHashDummyValue> local_90;
  QArrayData *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  GenericModelItem *local_68 [4];
  QByteArray local_48;
  
  local_90.d = (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0;
  lVar1 = (indexes->d).size;
  if (lVar1 == 0) {
LAB_0013022c:
    QVar13.d = (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0;
LAB_0013022f:
    local_90.d = QHashPrivate::Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_>::
                 detached(QVar13.d,0);
  }
  else {
    pQVar2 = (indexes->d).ptr;
    ppQVar12 = &pQVar2->m;
    do {
      if (((-1 < ((QModelIndex *)(ppQVar12 + -2))->r) && (-1 < *(int *)((long)ppQVar12 + -0xc))) &&
         (*ppQVar12 != (QAbstractItemModel *)0x0)) {
        local_68[0] = (GenericModelItem *)ppQVar12[-1];
        QHash<GenericModelItem*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<GenericModelItem*,QHashDummyValue> *)&local_90,local_68,
                   (QHashDummyValue *)&local_88);
      }
      pQVar5 = (QModelIndex *)(ppQVar12 + 1);
      ppQVar12 = ppQVar12 + 3;
    } while (pQVar5 != pQVar2 + lVar1);
    if (local_90.d == (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0)
    goto LAB_0013022c;
    QVar13.d = local_90.d;
    if (1 < (uint)((local_90.d)->ref).atomic._q_value.super___atomic_base<int>._M_i)
    goto LAB_0013022f;
  }
  QVar13.d = local_90.d;
  if ((local_90.d)->spans->offsets[0] == 0xff) {
    uVar8 = 1;
    do {
      sVar7 = uVar8;
      if ((local_90.d)->numBuckets == sVar7) {
        QVar13.d = (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0;
        sVar7 = 0;
        break;
      }
      uVar8 = sVar7 + 1;
    } while ((local_90.d)->spans[sVar7 >> 7].offsets[(uint)sVar7 & 0x7f] == 0xff);
    if (QVar13.d != (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0 ||
        sVar7 != 0) goto LAB_00130297;
  }
  else {
    sVar7 = 0;
LAB_00130297:
    it_00.bucket = sVar7;
    it_00.d = QVar13.d;
    do {
      uVar15 = it_00.bucket;
      pDVar14 = it_00.d;
      sVar7 = pDVar14->numBuckets;
      uVar8 = uVar15;
      do {
        uVar8 = uVar8 + 1;
        if (sVar7 == uVar8) goto LAB_001303c7;
      } while (pDVar14->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
      it.bucket = uVar8;
      it.d = pDVar14;
      do {
        uVar8 = it.bucket;
        pDVar6 = it.d;
        tVar10 = pDVar14->spans[uVar15 >> 7].entries
                 [pDVar14->spans[uVar15 >> 7].offsets[(uint)it_00.bucket & 0x7f]].storage;
        pSVar3 = pDVar6->spans;
        tVar4 = pSVar3[uVar8 >> 7].entries[pSVar3[uVar8 >> 7].offsets[(uint)it.bucket & 0x7f]].
                storage;
        if (tVar4 == (type)0x0) {
LAB_00130377:
          if (tVar10 != (type)0x0) {
            it_00 = (piter)QHash<GenericModelItem_*,_QHashDummyValue>::erase
                                     (&local_90,(const_iterator)it_00);
            goto LAB_0013040f;
          }
LAB_0013037c:
          do {
            if (pDVar6->numBuckets - 1 == uVar8) {
              it = (piter)ZEXT816(0);
              break;
            }
            uVar8 = uVar8 + 1;
            it.bucket = uVar8;
            it.d = pDVar6;
          } while (pSVar3[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
        }
        else {
          if (tVar10 != (type)0x0) {
            tVar11 = tVar4;
            if (tVar10 != tVar4) {
              do {
                tVar11 = *(type *)((long)tVar11 + 8);
                if (tVar11 == tVar10) break;
              } while (tVar11 != (type)0x0);
              if (tVar11 != (type)0x0) goto LAB_00130357;
              if (tVar10 != tVar4) {
                do {
                  tVar10 = *(type *)((long)tVar10 + 8);
                  if (tVar10 == tVar4) break;
                } while (tVar10 != (type)0x0);
                goto LAB_00130377;
              }
            }
            goto LAB_0013037c;
          }
LAB_00130357:
          it = (piter)QHash<GenericModelItem_*,_QHashDummyValue>::erase
                                (&local_90,(const_iterator)it);
        }
      } while ((it.d != (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0) ||
              (it.bucket != 0));
      sVar7 = pDVar14->numBuckets;
LAB_001303c7:
      do {
        if (sVar7 - 1 == uVar15) {
          it_00 = (piter)ZEXT816(0);
          break;
        }
        uVar15 = uVar15 + 1;
        it_00.bucket = uVar15;
        it_00.d = pDVar14;
      } while (pDVar14->spans[uVar15 >> 7].offsets[(uint)uVar15 & 0x7f] == 0xff);
LAB_0013040f:
    } while ((it_00.d != (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0) ||
            (it_00.bucket != 0));
  }
  local_88 = (QArrayData *)0x0;
  uStack_80 = 0;
  local_78 = 0;
  QDataStream::QDataStream((QDataStream *)local_68,&local_88,2);
  if (local_90.d == (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0) {
    iVar9 = 0;
  }
  else {
    iVar9 = (int)(local_90.d)->size;
  }
  QDataStream::operator<<((QDataStream *)local_68,iVar9);
  if ((local_90.d == (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0) ||
     (1 < (uint)((local_90.d)->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    local_90.d = QHashPrivate::Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_>::
                 detached(local_90.d,0);
  }
  QVar13.d = local_90.d;
  if ((local_90.d)->spans->offsets[0] == 0xff) {
    uVar8 = 1;
    do {
      uVar15 = uVar8;
      if ((local_90.d)->numBuckets == uVar15) {
        uVar15 = 0;
        QVar13.d = (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0;
        break;
      }
      uVar8 = uVar15 + 1;
    } while ((local_90.d)->spans[uVar15 >> 7].offsets[(uint)uVar15 & 0x7f] == 0xff);
    if (QVar13.d == (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0 &&
        uVar15 == 0) goto LAB_0013054e;
  }
  else {
    uVar15 = 0;
  }
  do {
    ::operator<<((QDataStream *)local_68,
                 (GenericModelItem *)
                 (QVar13.d)->spans[uVar15 >> 7].entries
                 [(QVar13.d)->spans[uVar15 >> 7].offsets[(uint)uVar15 & 0x7f]].storage);
    do {
      if ((QVar13.d)->numBuckets - 1 == uVar15) {
        QVar13.d = (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0;
        uVar15 = 0;
        break;
      }
      uVar15 = uVar15 + 1;
    } while ((QVar13.d)->spans[uVar15 >> 7].offsets[(uint)uVar15 & 0x7f] == 0xff);
  } while ((QVar13.d != (Data<QHashPrivate::Node<GenericModelItem_*,_QHashDummyValue>_> *)0x0) ||
          (uVar15 != 0));
LAB_0013054e:
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = "application/x-genericmodeldatalist";
  local_48.d.size = 0x22;
  QMimeData::setData((QString *)data,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  QDataStream::~QDataStream((QDataStream *)local_68);
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,1,8);
    }
  }
  QHash<GenericModelItem_*,_QHashDummyValue>::~QHash(&local_90);
  return;
}

Assistant:

void GenericModelPrivate::encodeMime(QMimeData *data, const QModelIndexList &indexes) const
{
    Q_ASSERT(data);
    Q_Q(const GenericModel);
    QSet<GenericModelItem *> itemsToSave;
    for (auto &&idx : indexes) {
        if (!idx.isValid())
            continue;
        Q_ASSERT(idx.model() == q);
        itemsToSave << itemForIndex(idx);
    }
    for (auto i = itemsToSave.begin(); i != itemsToSave.end();) {
        bool iToErase = false;
        auto j = i;
        for (++j; j != itemsToSave.end();) {
            if (GenericModelItem::isAnchestor(*i, *j)) {
                j = itemsToSave.erase(j);
                continue;
            }
            if (GenericModelItem::isAnchestor(*j, *i)) {
                iToErase = true;
                break;
            }
            ++j;
        }
        if (iToErase)
            i = itemsToSave.erase(i);
        else
            ++i;
    }
    QByteArray encoded;
    QDataStream stream(&encoded, QIODevice::WriteOnly);
    stream << qint32(itemsToSave.size());
    for (auto i = itemsToSave.begin(); i != itemsToSave.end(); ++i)
        stream << **i;
    data->setData(mimeDataName(), encoded);
}